

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O2

int Maj_ManMarkup(Maj_Man_t *p)

{
  Vec_Wec_t *pVVar1;
  int iVar2;
  int (*paaiVar3) [3] [32];
  int (*paaiVar4) [3] [32];
  int *piVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  
  p->iVar = 1;
  if (p->nObjs < 0x21) {
    piVar5 = p->VarMarks[p->nVars + 2][0] + 4;
    for (lVar7 = 4; lVar7 != 1; lVar7 = lVar7 + -1) {
      pVVar1 = p->vOutLits;
      iVar2 = Abc_Var2Lit(p->iVar,0);
      Vec_WecPush(pVVar1,(int)lVar7,iVar2);
      iVar2 = p->iVar;
      p->iVar = iVar2 + 1;
      *piVar5 = iVar2;
      piVar5 = piVar5 + 0x1f;
    }
    lVar7 = (long)(p->nVars + 3);
    paaiVar3 = p->VarMarks + lVar7;
    for (; lVar7 < p->nObjs; lVar7 = lVar7 + 1) {
      paaiVar4 = paaiVar3;
      for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
        if ((lVar6 == 0) && (p->fUseLine != 0)) {
          pVVar1 = p->vOutLits;
          iVar2 = Abc_Var2Lit(p->iVar,0);
          Vec_WecPush(pVVar1,(int)lVar7 + -1,iVar2);
          iVar2 = p->iVar;
          p->iVar = iVar2 + 1;
          *(int *)((long)p->VarMarks + lVar7 * 0x184 + -4) = iVar2;
        }
        else {
          uVar8 = (ulong)((uint)(p->fUseConst == 0) * 2);
          if (lVar6 != 2) {
            uVar8 = 2;
          }
          for (; (long)uVar8 < lVar7 - lVar6; uVar8 = uVar8 + 1) {
            pVVar1 = p->vOutLits;
            iVar2 = Abc_Var2Lit(p->iVar,0);
            Vec_WecPush(pVVar1,(int)uVar8,iVar2);
            iVar2 = p->iVar;
            p->iVar = iVar2 + 1;
            (*paaiVar4)[0][uVar8] = iVar2;
          }
        }
        paaiVar4 = (int (*) [3] [32])(*paaiVar4 + 1);
      }
      paaiVar3 = paaiVar3 + 1;
    }
    printf("The number of parameter variables = %d.\n",(ulong)(uint)p->iVar);
    return p->iVar;
  }
  __assert_fail("p->nObjs <= MAJ_NOBJS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcMaj.c"
                ,0x5d,"int Maj_ManMarkup(Maj_Man_t *)");
}

Assistant:

int Maj_ManMarkup( Maj_Man_t * p )
{
    int i, k, j;
    p->iVar = 1;
    assert( p->nObjs <= MAJ_NOBJS );
    // make exception for the first node
    i = p->nVars + 2;
    for ( k = 0; k < 3; k++ )
    {
        j = 4-k;
        Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
        p->VarMarks[i][k][j] = p->iVar++;
    }
    // assign variables for other nodes
    for ( i = p->nVars + 3; i < p->nObjs; i++ )
    {
        for ( k = 0; k < 3; k++ )
        {
            if ( p->fUseLine && k == 0 )
            {
                j = i-1;
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
                continue;
            }
            for ( j = (p->fUseConst && k == 2) ? 0 : 2; j < i - k; j++ )
            {
                Vec_WecPush( p->vOutLits, j, Abc_Var2Lit(p->iVar, 0) );
                p->VarMarks[i][k][j] = p->iVar++;
            }
        }
    }
    printf( "The number of parameter variables = %d.\n", p->iVar );
    return p->iVar;
    // printout
    for ( i = p->nVars + 2; i < p->nObjs; i++ )
    {
        printf( "Node %d\n", i );
        for ( j = 0; j < p->nObjs; j++ )
        {
            for ( k = 0; k < 3; k++ )
                printf( "%3d ", p->VarMarks[i][k][j] );
            printf( "\n" );
        }
    }
    return p->iVar;
}